

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void bwtil::save_bitview_to_file(bitview_t *bv,size_t size,FILE *fp)

{
  size_t end;
  ulint in_RAX;
  size_t begin;
  ulint x;
  
  begin = 0;
  x = in_RAX;
  while (end = begin + 0x40, end <= size) {
    x = ::bv::internal::bitview<std::vector>::get(bv,begin,end);
    fwrite(&x,8,1,(FILE *)fp);
    begin = end;
  }
  if (begin < size) {
    x = ::bv::internal::bitview<std::vector>::get(bv,begin,size);
    fwrite(&x,8,1,(FILE *)fp);
  }
  return;
}

Assistant:

inline void save_bitview_to_file(bitview_t bv, size_t size, FILE * fp){

	ulint i = 0;
	ulint x;

	while(i+64<=size){

		x = bv.get(i,i+64);
		fwrite(&x, sizeof(ulint), 1, fp);

		i+=64;

	}

	if(i<size){

		x = bv.get(i,size);
		fwrite(&x, sizeof(ulint), 1, fp);

	}

}